

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimePicker::mouseMoveEvent(DateTimePicker *this,QMouseEvent *event)

{
  int iVar1;
  DateTimePickerPrivate *pDVar2;
  QMouseEvent QVar3;
  reference pSVar4;
  QPoint QVar5;
  double dVar6;
  double in_XMM1_Qa;
  
  if (((this->d).d)->leftMouseButtonPressed == true) {
    QEventPoint::position();
    pDVar2 = (this->d).d;
    if ((long)pDVar2->movableSection != -1) {
      dVar6 = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_0017b3a0) + in_XMM1_Qa;
      iVar1 = (pDVar2->mousePos).yp;
      pSVar4 = QList<QtMWidgets::Section>::operator[]
                         (&(pDVar2->super_DateTimeParser).sections,(long)pDVar2->movableSection);
      pSVar4->offset = pSVar4->offset + ((int)dVar6 - iVar1);
    }
    dVar6 = (double)QEventPoint::position();
    QVar5.xp = (int)((double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6);
    QVar5.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                    in_XMM1_Qa);
    ((this->d).d)->mousePos = QVar5;
    QWidget::update();
    QVar3 = (QMouseEvent)0x1;
  }
  else {
    QVar3 = (QMouseEvent)0x0;
  }
  event[0xc] = QVar3;
  return;
}

Assistant:

void
DateTimePicker::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		const int delta = event->pos().y() - d->mousePos.y();
		d->updateOffset( delta );
		d->mousePos = event->pos();
		update();

		event->accept();
	}
	else
		event->ignore();
}